

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int stats_mutexes_reset_ctl
              (tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
              size_t newlen)

{
  uint ind;
  arena_t *arena_00;
  tsdn_t *in_RDI;
  bin_t *bin;
  uint k;
  szind_t j;
  arena_t *arena;
  uint i;
  uint n;
  tsdn_t *tsdn;
  malloc_mutex_t *in_stack_ffffffffffffff98;
  bin_t *in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffac;
  tsdn_t *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  uint uVar1;
  undefined4 in_stack_ffffffffffffffbc;
  
  malloc_mutex_lock((tsdn_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (malloc_mutex_t *)in_stack_ffffffffffffffb0);
  duckdb_je_malloc_mutex_prof_data_reset
            ((tsdn_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  malloc_mutex_unlock(in_stack_ffffffffffffffb0,
                      (malloc_mutex_t *)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  malloc_mutex_lock((tsdn_t *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                    (malloc_mutex_t *)in_stack_ffffffffffffffb0);
  duckdb_je_malloc_mutex_prof_data_reset
            ((tsdn_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  malloc_mutex_unlock(in_stack_ffffffffffffffb0,
                      (malloc_mutex_t *)
                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
  ind = duckdb_je_narenas_total_get();
  for (uVar1 = 0; uVar1 < ind; uVar1 = uVar1 + 1) {
    arena_00 = arena_get(in_RDI,ind,SUB41(uVar1 >> 0x18,0));
    if (arena_00 != (arena_t *)0x0) {
      malloc_mutex_lock((tsdn_t *)CONCAT44(ind,uVar1),(malloc_mutex_t *)arena_00);
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      malloc_mutex_unlock((tsdn_t *)arena_00,
                          (malloc_mutex_t *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      malloc_mutex_lock((tsdn_t *)CONCAT44(ind,uVar1),(malloc_mutex_t *)arena_00);
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      malloc_mutex_unlock((tsdn_t *)arena_00,
                          (malloc_mutex_t *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      malloc_mutex_lock((tsdn_t *)CONCAT44(ind,uVar1),(malloc_mutex_t *)arena_00);
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      malloc_mutex_unlock((tsdn_t *)arena_00,
                          (malloc_mutex_t *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      malloc_mutex_lock((tsdn_t *)CONCAT44(ind,uVar1),(malloc_mutex_t *)arena_00);
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      malloc_mutex_unlock((tsdn_t *)arena_00,
                          (malloc_mutex_t *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      malloc_mutex_lock((tsdn_t *)CONCAT44(ind,uVar1),(malloc_mutex_t *)arena_00);
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      malloc_mutex_unlock((tsdn_t *)arena_00,
                          (malloc_mutex_t *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      malloc_mutex_lock((tsdn_t *)CONCAT44(ind,uVar1),(malloc_mutex_t *)arena_00);
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      malloc_mutex_unlock((tsdn_t *)arena_00,
                          (malloc_mutex_t *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      malloc_mutex_lock((tsdn_t *)CONCAT44(ind,uVar1),(malloc_mutex_t *)arena_00);
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      malloc_mutex_unlock((tsdn_t *)arena_00,
                          (malloc_mutex_t *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      malloc_mutex_lock((tsdn_t *)CONCAT44(ind,uVar1),(malloc_mutex_t *)arena_00);
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      malloc_mutex_unlock((tsdn_t *)arena_00,
                          (malloc_mutex_t *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      malloc_mutex_lock((tsdn_t *)CONCAT44(ind,uVar1),(malloc_mutex_t *)arena_00);
      duckdb_je_malloc_mutex_prof_data_reset
                ((tsdn_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
      malloc_mutex_unlock((tsdn_t *)arena_00,
                          (malloc_mutex_t *)
                          CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
      for (in_stack_ffffffffffffffac = 0; in_stack_ffffffffffffffac < 0x24;
          in_stack_ffffffffffffffac = in_stack_ffffffffffffffac + 1) {
        for (in_stack_ffffffffffffffa8 = 0;
            in_stack_ffffffffffffffa8 < duckdb_je_bin_infos[in_stack_ffffffffffffffac].n_shards;
            in_stack_ffffffffffffffa8 = in_stack_ffffffffffffffa8 + 1) {
          in_stack_ffffffffffffffa0 =
               arena_get_bin(arena_00,in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8);
          malloc_mutex_lock((tsdn_t *)CONCAT44(ind,uVar1),(malloc_mutex_t *)arena_00);
          duckdb_je_malloc_mutex_prof_data_reset
                    ((tsdn_t *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
          malloc_mutex_unlock((tsdn_t *)arena_00,
                              (malloc_mutex_t *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
        }
      }
    }
  }
  return 0;
}

Assistant:

static int
stats_mutexes_reset_ctl(tsd_t *tsd, const size_t *mib,
    size_t miblen, void *oldp, size_t *oldlenp,
    void *newp, size_t newlen) {
	if (!config_stats) {
		return ENOENT;
	}

	tsdn_t *tsdn = tsd_tsdn(tsd);

#define MUTEX_PROF_RESET(mtx)						\
    malloc_mutex_lock(tsdn, &mtx);					\
    malloc_mutex_prof_data_reset(tsdn, &mtx);				\
    malloc_mutex_unlock(tsdn, &mtx);

	/* Global mutexes: ctl and prof. */
	MUTEX_PROF_RESET(ctl_mtx);
	if (have_background_thread) {
		MUTEX_PROF_RESET(background_thread_lock);
	}
	if (config_prof && opt_prof) {
		MUTEX_PROF_RESET(bt2gctx_mtx);
		MUTEX_PROF_RESET(tdatas_mtx);
		MUTEX_PROF_RESET(prof_dump_mtx);
		MUTEX_PROF_RESET(prof_recent_alloc_mtx);
		MUTEX_PROF_RESET(prof_recent_dump_mtx);
		MUTEX_PROF_RESET(prof_stats_mtx);
	}

	/* Per arena mutexes. */
	unsigned n = narenas_total_get();

	for (unsigned i = 0; i < n; i++) {
		arena_t *arena = arena_get(tsdn, i, false);
		if (!arena) {
			continue;
		}
		MUTEX_PROF_RESET(arena->large_mtx);
		MUTEX_PROF_RESET(arena->pa_shard.edata_cache.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.ecache_dirty.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.ecache_muzzy.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.ecache_retained.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.decay_dirty.mtx);
		MUTEX_PROF_RESET(arena->pa_shard.pac.decay_muzzy.mtx);
		MUTEX_PROF_RESET(arena->tcache_ql_mtx);
		MUTEX_PROF_RESET(arena->base->mtx);

		for (szind_t j = 0; j < SC_NBINS; j++) {
			for (unsigned k = 0; k < bin_infos[j].n_shards; k++) {
				bin_t *bin = arena_get_bin(arena, j, k);
				MUTEX_PROF_RESET(bin->lock);
			}
		}
	}
#undef MUTEX_PROF_RESET
	return 0;
}